

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O2

HashEntry * raviX_hash_table_search_pre_hashed(HashTable *ht,uint32_t hash,void *key)

{
  uint32_t *puVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  HashEntry *pHVar6;
  
  uVar4 = ht->size;
  uVar2 = (ulong)uVar4;
  uVar5 = (ulong)hash % uVar2;
  do {
    puVar1 = (uint32_t *)ht->table[uVar5].key;
    if (puVar1 == (uint32_t *)0x0) {
      return (HashEntry *)0x0;
    }
    if ((puVar1 != &deleted_key_value) && (pHVar6 = ht->table + uVar5, pHVar6->hash == hash)) {
      iVar3 = (*ht->key_equals_function)(key,puVar1);
      if (iVar3 != 0) {
        return pHVar6;
      }
      uVar4 = ht->size;
    }
    uVar5 = (ulong)((int)uVar5 + 1 + hash % ht->rehash) % (ulong)uVar4;
  } while ((int)uVar5 != (int)((ulong)hash % uVar2));
  return (HashEntry *)0x0;
}

Assistant:

HashEntry *
raviX_hash_table_search_pre_hashed(HashTable *ht, uint32_t hash,
			     const void *key)
{
	uint32_t start_hash_address = hash % ht->size;
	uint32_t hash_address = start_hash_address;

	do {
		uint32_t double_hash;

		HashEntry *entry = ht->table + hash_address;

		if (entry_is_free(entry)) {
			return NULL;
		} else if (entry_is_present(entry) && entry->hash == hash) {
			if (ht->key_equals_function(key, entry->key)) {
				return entry;
			}
		}

		double_hash = 1 + hash % ht->rehash;

		hash_address = (hash_address + double_hash) % ht->size;
	} while (hash_address != start_hash_address);

	return NULL;
}